

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void SHA256_Update_Y(SHA256_CTX_Y *ctx,void *in,size_t len)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uchar *__dest;
  ulong __n;
  
  uVar1 = ctx->count[1];
  uVar2 = (ulong)(uVar1 >> 3 & 0x3f);
  uVar3 = (int)len * 8;
  ctx->count[1] = uVar3 + uVar1;
  ctx->count[0] = ctx->count[0] + (int)(len >> 0x1d) + (uint)CARRY4(uVar3,uVar1);
  __n = 0x40 - uVar2;
  __dest = ctx->buf + uVar2;
  if (__n <= len) {
    memcpy(__dest,in,__n);
    SHA256_Transform((SHA256_CTX *)ctx,ctx->buf);
    in = (void *)((long)in + __n);
    for (len = len - __n; __dest = ctx->buf, 0x3f < len; len = len - 0x40) {
      SHA256_Transform((SHA256_CTX *)ctx,(uchar *)in);
      in = (void *)((long)in + 0x40);
    }
  }
  memcpy(__dest,in,len);
  return;
}

Assistant:

void
SHA256_Update_Y(SHA256_CTX_Y * ctx, const void *in, size_t len)
{
	uint32_t bitlen[2];
	uint32_t r;
	const unsigned char *src = in;

	/* Number of bytes left in the buffer from previous updates */
	r = (ctx->count[1] >> 3) & 0x3f;

	/* Convert the length into a number of bits */
	bitlen[1] = ((uint32_t)len) << 3;
	bitlen[0] = (uint32_t)(len >> 29);

	/* Update number of bits */
	if ((ctx->count[1] += bitlen[1]) < bitlen[1])
		ctx->count[0]++;
	ctx->count[0] += bitlen[0];

	/* Handle the case where we don't need to perform any transforms */
	if (len < 64 - r) {
		memcpy(&ctx->buf[r], src, len);
		return;
	}

	/* Finish the current block */
	memcpy(&ctx->buf[r], src, 64 - r);
	SHA256_Transform(ctx->state, ctx->buf);
	src += 64 - r;
	len -= 64 - r;

	/* Perform complete blocks */
	while (len >= 64) {
		SHA256_Transform(ctx->state, src);
		src += 64;
		len -= 64;
	}

	/* Copy left over data into buffer */
	memcpy(ctx->buf, src, len);
}